

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

void test_union_intersection(void)

{
  bitset_t *b1_00;
  bitset_t *bitset;
  size_t sVar1;
  int k;
  bitset_t *unaff_retaddr;
  bitset_t *b2;
  bitset_t *b1;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  b1_00 = bitset_create();
  bitset = bitset_create();
  for (iVar2 = 0; iVar2 < 1000; iVar2 = iVar2 + 1) {
    bitset_set(bitset,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    bitset_set(bitset,CONCAT44(iVar2,in_stack_ffffffffffffffe8));
  }
  bitset_inplace_symmetric_difference(b2,unaff_retaddr);
  sVar1 = bitset_count(bitset);
  if (sVar1 != 2000) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_union_intersection",0x7f);
    exit(1);
  }
  bitset_inplace_symmetric_difference(b2,unaff_retaddr);
  sVar1 = bitset_count(bitset);
  if (sVar1 != 1000) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_union_intersection",0x81);
    exit(1);
  }
  bitset_inplace_difference(b1_00,bitset);
  sVar1 = bitset_count(bitset);
  if (sVar1 != 1000) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_union_intersection",0x83);
    exit(1);
  }
  bitset_inplace_union(b2,unaff_retaddr);
  sVar1 = bitset_count(bitset);
  if (sVar1 != 2000) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_union_intersection",0x85);
    exit(1);
  }
  bitset_inplace_intersection(b1_00,bitset);
  sVar1 = bitset_count(bitset);
  if (sVar1 != 1000) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_union_intersection",0x87);
    exit(1);
  }
  bitset_inplace_difference(b1_00,bitset);
  sVar1 = bitset_count(bitset);
  if (sVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_union_intersection",0x89);
    exit(1);
  }
  bitset_inplace_union(b2,unaff_retaddr);
  bitset_inplace_difference(bitset,b1_00);
  sVar1 = bitset_count(bitset);
  if (sVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s at line %d\n","test_union_intersection",0x8c);
    exit(1);
  }
  bitset_free((bitset_t *)0x101d4c);
  bitset_free((bitset_t *)0x101d56);
  return;
}

Assistant:

void test_union_intersection() {
  bitset_t *b1 = bitset_create();
  bitset_t *b2 = bitset_create();

  for (int k = 0; k < 1000; ++k) {
    bitset_set(b1, 2 * k);
    bitset_set(b2, 2 * k + 1);
  }
  // calling xor twice should leave things unchanged
  bitset_inplace_symmetric_difference(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 2000);
  bitset_inplace_symmetric_difference(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 1000);
  bitset_inplace_difference(b1, b2); // should make no difference
  TEST_ASSERT(bitset_count(b1) == 1000);
  bitset_inplace_union(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 2000);
  bitset_inplace_intersection(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 1000);
  bitset_inplace_difference(b1, b2);
  TEST_ASSERT(bitset_count(b1) == 0);
  bitset_inplace_union(b1, b2);
  bitset_inplace_difference(b2, b1);
  TEST_ASSERT(bitset_count(b2) == 0);
  bitset_free(b1);
  bitset_free(b2);
}